

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_2299d::testTiledImage
               (Box2i *dataWindow,string *fileName,LevelMode levelMode,
               LevelRoundingMode levelRoundingMode)

{
  Vec2<int> *pVVar1;
  ostream *poVar2;
  long *plVar3;
  Rand48 random;
  DeepImage img2;
  DeepImage img1;
  Rand48 local_106;
  DeepImage local_100;
  Image local_98;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tiles, data window = (",0x16);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - (",5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), level mode = ",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,levelMode);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", rounding mode = ",0x12);
  plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,levelRoundingMode);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  Imf_2_5::DeepImage::DeepImage((DeepImage *)&local_98);
  Imf_2_5::Image::resize(&local_98,dataWindow,levelMode,levelRoundingMode);
  pVVar1 = &local_100.super_Image._dataWindow.max;
  local_100.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"H1","");
  Imf_2_5::Image::insertChannel(&local_98,(string *)&local_100,HALF,1,1,false);
  if ((Vec2<int> *)local_100.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_100.super_Image._vptr_Image,
                    (long)local_100.super_Image._dataWindow.max + 1);
  }
  local_100.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"H2","");
  Imf_2_5::Image::insertChannel(&local_98,(string *)&local_100,HALF,1,1,true);
  if ((Vec2<int> *)local_100.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_100.super_Image._vptr_Image,
                    (long)local_100.super_Image._dataWindow.max + 1);
  }
  local_100.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"F","");
  Imf_2_5::Image::insertChannel(&local_98,(string *)&local_100,FLOAT,1,1,false);
  if ((Vec2<int> *)local_100.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_100.super_Image._vptr_Image,
                    (long)local_100.super_Image._dataWindow.max + 1);
  }
  local_100.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"UI","");
  Imf_2_5::Image::insertChannel(&local_98,(string *)&local_100,UINT,1,1,false);
  if ((Vec2<int> *)local_100.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_100.super_Image._vptr_Image,
                    (long)local_100.super_Image._dataWindow.max + 1);
  }
  local_106._state[0] = 0x5a5a;
  local_106._state[1] = 0x5a5a;
  local_106._state[2] = 0x5a5a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    generating random pixel values",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  fillChannels(&local_106,(DeepImage *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    saving file",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  Imf_2_5::saveDeepTiledImage(fileName,(DeepImage *)&local_98);
  Imf_2_5::DeepImage::DeepImage(&local_100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    loading file",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  Imf_2_5::loadDeepImage(fileName,&local_100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  verifyImagesAreEqual((DeepImage *)&local_98,&local_100,0,0);
  remove((fileName->_M_dataplus)._M_p);
  Imf_2_5::DeepImage::~DeepImage(&local_100);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)&local_98);
  return;
}

Assistant:

void
testTiledImage
    (const Box2i &dataWindow,
     const string &fileName,
     LevelMode levelMode,
     LevelRoundingMode levelRoundingMode)
{
    cout << "tiles, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << "), "
            "level mode = " << levelMode << ", "
            "rounding mode = " << levelRoundingMode << endl;

    DeepImage img1;
    img1.resize (dataWindow, levelMode, levelRoundingMode);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveDeepTiledImage (fileName, img1);
    
    DeepImage img2;

    cout << "    loading file" << endl;
    loadDeepImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str());
}